

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O1

void __thiscall EmitPrettyPrint::advanceleft(EmitPrettyPrint *this)

{
  TokenSplit *tok;
  printclass pVar1;
  TokenSplit *pTVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (this->tokqueue).cache[(this->tokqueue).left].size;
  do {
    if (iVar4 < 0) {
      return;
    }
    pTVar2 = (this->tokqueue).cache;
    iVar3 = (this->tokqueue).left;
    tok = pTVar2 + iVar3;
    print(this,tok);
    pVar1 = pTVar2[iVar3].delimtype;
    if (pVar1 == tokenstring) {
LAB_002fc2fd:
      this->leftotal = this->leftotal + iVar4;
    }
    else if (pVar1 == tokenbreak) {
      iVar4 = tok->numspaces;
      goto LAB_002fc2fd;
    }
    iVar4 = (this->tokqueue).max;
    iVar3 = ((this->tokqueue).left + 1) % iVar4;
    (this->tokqueue).left = iVar3;
    if (iVar3 == ((this->tokqueue).right + 1) % iVar4) {
      return;
    }
    iVar4 = (this->tokqueue).cache[iVar3].size;
  } while( true );
}

Assistant:

void EmitPrettyPrint::advanceleft(void)

{
  int4 l = tokqueue.bottom().getSize();
  while(l >= 0) {
    const TokenSplit &tok( tokqueue.bottom() );
    print(tok);
    switch(tok.getClass()) {
    case TokenSplit::tokenbreak:
      leftotal += tok.getNumSpaces();
      break;
    case TokenSplit::tokenstring:
      leftotal += l;
      break;
    default:
      break;
    }
    tokqueue.popbottom();
    if (tokqueue.empty()) break;
    l = tokqueue.bottom().getSize();
  }
}